

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O0

ssize_t rpm_filter_read(archive_read_filter *self,void **buff)

{
  long lVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool local_61;
  uint32_t bytes;
  uint32_t section;
  size_t n;
  size_t used;
  ssize_t total;
  ssize_t avail_in;
  uchar *b;
  rpm *rpm;
  void **buff_local;
  archive_read_filter *self_local;
  
  b = (uchar *)self->data;
  *buff = (void *)0x0;
  total = 0;
  used = 0;
  avail_in = 0;
  n = 0;
  rpm = (rpm *)buff;
  buff_local = (void **)self;
  do {
    if ((avail_in == 0) &&
       (avail_in = (ssize_t)__archive_read_filter_ahead
                                      ((archive_read_filter *)buff_local[2],1,&total),
       (void *)avail_in == (void *)0x0)) {
      if (total < 0) {
        return -0x1e;
      }
      break;
    }
    switch(*(undefined4 *)(b + 0x28)) {
    case 0:
      lVar1 = total;
      if (0x5f < *(long *)b + total) {
        lVar1 = *(long *)b;
        avail_in = (0x60 - lVar1) + avail_in;
        b[0x28] = '\x01';
        b[0x29] = '\0';
        b[0x2a] = '\0';
        b[0x2b] = '\0';
        b[8] = '\0';
        b[9] = '\0';
        b[10] = '\0';
        b[0xb] = '\0';
        b[0xc] = '\0';
        b[0xd] = '\0';
        b[0xe] = '\0';
        b[0xf] = '\0';
        b[0x10] = '\0';
        b[0x11] = '\0';
        b[0x12] = '\0';
        b[0x13] = '\0';
        b[0x14] = '\0';
        b[0x15] = '\0';
        b[0x16] = '\0';
        b[0x17] = '\0';
        b[0x2c] = '\x01';
        b[0x2d] = '\0';
        b[0x2e] = '\0';
        b[0x2f] = '\0';
        lVar1 = 0x60 - lVar1;
      }
      n = lVar1 + n;
      break;
    case 1:
      _bytes = 0x10 - *(long *)(b + 8);
      if (total - n < _bytes) {
        _bytes = total - n;
      }
      memcpy(b + *(long *)(b + 8) + 0x18,(void *)avail_in,_bytes);
      avail_in = _bytes + avail_in;
      n = _bytes + n;
      *(ulong *)(b + 8) = _bytes + *(long *)(b + 8);
      if (*(long *)(b + 8) == 0x10) {
        if ((((b[0x18] == 0x8e) && (b[0x19] == 0xad)) && (b[0x1a] == 0xe8)) && (b[0x1b] == '\x01'))
        {
          uVar2 = archive_be32dec(b + 0x20);
          uVar3 = archive_be32dec(b + 0x24);
          *(ulong *)(b + 0x10) = (ulong)(uVar2 * 0x10 + 0x10 + uVar3);
          b[0x28] = '\x02';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
          b[0x2c] = '\0';
          b[0x2d] = '\0';
          b[0x2e] = '\0';
          b[0x2f] = '\0';
        }
        else {
          if (*(int *)(b + 0x2c) != 0) {
            archive_set_error((archive *)buff_local[3],0x54,"Unrecognized rpm header");
            return -0x1e;
          }
          b[0x28] = '\x04';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
          rpm->total_in = (int64_t)(b + 0x18);
          used = *(size_t *)(b + 8);
        }
      }
      break;
    case 2:
      _bytes = *(long *)(b + 0x10) - *(long *)(b + 8);
      if (total - n < _bytes) {
        _bytes = total - n;
      }
      avail_in = _bytes + avail_in;
      n = _bytes + n;
      *(ulong *)(b + 8) = _bytes + *(long *)(b + 8);
      if (*(long *)(b + 8) == *(long *)(b + 0x10)) {
        b[0x28] = '\x03';
        b[0x29] = '\0';
        b[0x2a] = '\0';
        b[0x2b] = '\0';
      }
      break;
    case 3:
      for (; n < (ulong)total; n = n + 1) {
        if (*(char *)avail_in != '\0') {
          b[0x28] = '\x01';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
          b[8] = '\0';
          b[9] = '\0';
          b[10] = '\0';
          b[0xb] = '\0';
          b[0xc] = '\0';
          b[0xd] = '\0';
          b[0xe] = '\0';
          b[0xf] = '\0';
          b[0x10] = '\0';
          b[0x11] = '\0';
          b[0x12] = '\0';
          b[0x13] = '\0';
          b[0x14] = '\0';
          b[0x15] = '\0';
          b[0x16] = '\0';
          b[0x17] = '\0';
          break;
        }
        avail_in = avail_in + 1;
      }
      break;
    case 4:
      rpm->total_in = avail_in;
      used = total;
      n = total;
    }
    if (n == total) {
      *(size_t *)b = n + *(long *)b;
      __archive_read_filter_consume((archive_read_filter *)buff_local[2],n);
      avail_in = 0;
      n = 0;
    }
    local_61 = used == 0 && 0 < total;
  } while (local_61);
  if ((n != 0) && (avail_in != 0)) {
    *(size_t *)b = n + *(long *)b;
    __archive_read_filter_consume((archive_read_filter *)buff_local[2],n);
  }
  return used;
}

Assistant:

static ssize_t
rpm_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct rpm *rpm;
	const unsigned char *b;
	ssize_t avail_in, total;
	size_t used, n;
	uint32_t section;
	uint32_t bytes;

	rpm = (struct rpm *)self->data;
	*buff = NULL;
	total = avail_in = 0;
	b = NULL;
	used = 0;
	do {
		if (b == NULL) {
			b = __archive_read_filter_ahead(self->upstream, 1,
			    &avail_in);
			if (b == NULL) {
				if (avail_in < 0)
					return (ARCHIVE_FATAL);
				else
					break;
			}
		}

		switch (rpm->state) {
		case ST_LEAD:
			if (rpm->total_in + avail_in < RPM_LEAD_SIZE)
				used += avail_in;
			else {
				n = (size_t)(RPM_LEAD_SIZE - rpm->total_in);
				used += n;
				b += n;
				rpm->state = ST_HEADER;
				rpm->hpos = 0;
				rpm->hlen = 0;
				rpm->first_header = 1;
			}
			break;
		case ST_HEADER:
			n = 16 - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			memcpy(rpm->header+rpm->hpos, b, n);
			b += n;
			used += n;
			rpm->hpos += n;

			if (rpm->hpos == 16) {
				if (rpm->header[0] != 0x8e ||
				    rpm->header[1] != 0xad ||
				    rpm->header[2] != 0xe8 ||
				    rpm->header[3] != 0x01) {
					if (rpm->first_header) {
						archive_set_error(
						    &self->archive->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Unrecognized rpm header");
						return (ARCHIVE_FATAL);
					}
					rpm->state = ST_ARCHIVE;
					*buff = rpm->header;
					total = rpm->hpos;
					break;
				}
				/* Calculate 'Header' length. */
				section = archive_be32dec(rpm->header+8);
				bytes = archive_be32dec(rpm->header+12);
				rpm->hlen = 16 + section * 16 + bytes;
				rpm->state = ST_HEADER_DATA;
				rpm->first_header = 0;
			}
			break;
		case ST_HEADER_DATA:
			n = rpm->hlen - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			b += n;
			used += n;
			rpm->hpos += n;
			if (rpm->hpos == rpm->hlen)
				rpm->state = ST_PADDING;
			break;
		case ST_PADDING:
			while (used < (size_t)avail_in) {
				if (*b != 0) {
					/* Read next header. */
					rpm->state = ST_HEADER;
					rpm->hpos = 0;
					rpm->hlen = 0;
					break;
				}
				b++;
				used++;
			}
			break;
		case ST_ARCHIVE:
			*buff = b;
			total = avail_in;
			used = avail_in;
			break;
		}
		if (used == (size_t)avail_in) {
			rpm->total_in += used;
			__archive_read_filter_consume(self->upstream, used);
			b = NULL;
			used = 0;
		}
	} while (total == 0 && avail_in > 0);

	if (used > 0 && b != NULL) {
		rpm->total_in += used;
		__archive_read_filter_consume(self->upstream, used);
	}
	return (total);
}